

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.c
# Opt level: O1

sexp sexp_adjust_bytecode(sexp dstp,_func_sexp_void_ptr_sexp *adjust_fn,void *adata)

{
  int iVar1;
  sexp psVar2;
  size_t sVar3;
  int iVar4;
  char *__format;
  long lVar5;
  
  if ((dstp->value).type.getters != (sexp)0x0) {
    psVar2 = (sexp)0x0;
    iVar4 = 0;
    do {
      lVar5 = (long)iVar4;
      iVar1 = iVar4 + 1;
      switch((dstp->value).flonum_bits[(long)(&(psVar2->value).flonum + 4)]) {
      case '\x05':
      case '\x06':
      case '\a':
      case '\b':
      case '\t':
      case '\n':
      case '\v':
      case '\f':
      case '\x0f':
      case '\x12':
      case '\x13':
      case '\x14':
        psVar2 = *(sexp *)((long)&dstp->value + lVar5 + 0x29);
        if (((ulong)psVar2 & 3) == 0 && psVar2 != (sexp)0x0) {
          psVar2 = (*adjust_fn)(adata,psVar2);
          if (((ulong)psVar2 & 3) != 0) {
            __format = " from adjust bytecode, FCALLN";
LAB_0011f5dc:
            sVar3 = strlen(gc_heap_err_str);
            snprintf(gc_heap_err_str + sVar3,0x100 - sVar3,__format);
            return (sexp)&DAT_0000003e;
          }
          *(sexp *)((long)&dstp->value + lVar5 + 0x29) = psVar2;
        }
      case '\r':
      case '\x0e':
      case '\x15':
      case '\x16':
      case '\x17':
      case '\x18':
      case '/':
        iVar1 = iVar4 + 9;
        break;
      case '&':
        psVar2 = *(sexp *)((long)&dstp->value + lVar5 + 0x39);
        if (((ulong)psVar2 & 3) == 0 && psVar2 != (sexp)0x0) {
          psVar2 = (*adjust_fn)(adata,psVar2);
          if (((ulong)psVar2 & 3) != 0) {
            __format = " from adjust bytecode, PROCEDURE";
            goto LAB_0011f5dc;
          }
          *(sexp *)((long)&dstp->value + lVar5 + 0x39) = psVar2;
        }
        iVar1 = iVar4 + 0x19;
        break;
      case '0':
      case '1':
      case '2':
        iVar1 = iVar4 + 0x11;
      }
      iVar4 = iVar1;
      psVar2 = (sexp)(long)iVar4;
    } while (psVar2 < (dstp->value).type.getters);
  }
  return (sexp)&DAT_0000013e;
}

Assistant:

static sexp sexp_adjust_bytecode(sexp dstp, sexp (*adjust_fn)(void *, sexp), void *adata) {
  sexp res = SEXP_FALSE;
  sexp   src, dst;
  sexp*  vec;
  int    i;
  
  for (i=0; i < sexp_bytecode_length(dstp); ) {
    switch (sexp_bytecode_data(dstp)[i++]) {
    case SEXP_OP_FCALL0:      case SEXP_OP_FCALL1:
    case SEXP_OP_FCALL2:      case SEXP_OP_FCALL3:
    case SEXP_OP_FCALL4:      case SEXP_OP_CALL:
    case SEXP_OP_TAIL_CALL:   case SEXP_OP_PUSH:
    case SEXP_OP_GLOBAL_REF:  case SEXP_OP_GLOBAL_KNOWN_REF:
#if SEXP_USE_GREEN_THREADS
    case SEXP_OP_PARAMETER_REF:
#endif
#if SEXP_USE_EXTENDED_FCALL
    case SEXP_OP_FCALLN:
#endif
      vec = (sexp*)(&(sexp_bytecode_data(dstp)[i]));
      src = vec[0];
      if (src && sexp_pointerp(src)) {
        dst = adjust_fn(adata, src);
        if (!sexp_pointerp(dst)) {
          size_t sz = strlen(gc_heap_err_str);
          snprintf(gc_heap_err_str + sz, ERR_STR_SIZE - sz, " from adjust bytecode, FCALLN");
          goto done; }
        vec[0] = dst;
      }
      /* ... FALLTHROUGH ... */
    case SEXP_OP_JUMP:        case SEXP_OP_JUMP_UNLESS:
    case SEXP_OP_STACK_REF:   case SEXP_OP_CLOSURE_REF:
    case SEXP_OP_LOCAL_REF:   case SEXP_OP_LOCAL_SET:
    case SEXP_OP_TYPEP:
#if SEXP_USE_RESERVE_OPCODE
    case SEXP_OP_RESERVE:
#endif
      i += sizeof(sexp); break;
    case SEXP_OP_MAKE: case SEXP_OP_SLOT_REF: case SEXP_OP_SLOT_SET:
      i += 2*sizeof(sexp); break;
    case SEXP_OP_MAKE_PROCEDURE:
      vec = (sexp*)(&(sexp_bytecode_data(dstp)[i]));
      src = vec[2];
      if (src && sexp_pointerp(src)) {
        dst = adjust_fn(adata, src);
        if (!sexp_pointerp(dst)) { 
          size_t sz = strlen(gc_heap_err_str);
          snprintf(gc_heap_err_str + sz, ERR_STR_SIZE - sz, " from adjust bytecode, PROCEDURE");
          goto done; }
        vec[2] = dst;
      }
      i += 3*sizeof(sexp); break;
    }
  }
  res = SEXP_TRUE;
done:
  return res;
}